

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O3

void zt_log_set_debug_info(char *file,int line,char *func)

{
  zt_log_ctx_ty *pzVar1;
  
  pzVar1 = zt_log_get_ctx();
  pzVar1->file = file;
  pzVar1->line = line;
  pzVar1->function = func;
  return;
}

Assistant:

void
zt_log_set_debug_info(const char * file, int line, const char * func) {
    zt_log_ctx_ty   * ctx;

    if ((ctx = zt_log_get_ctx()) == NULL) {
        return;
    }

    ctx->file     = (char*)file;
    ctx->line     = line;
    ctx->function = (char*)func;
}